

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRCombinedImageSampler * __thiscall
spirv_cross::Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>(Compiler *this,uint32_t id)

{
  SPIRCombinedImageSampler *pSVar1;
  
  if (((ulong)id < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeCombinedImageSampler
     )) {
    pSVar1 = Variant::get<spirv_cross::SPIRCombinedImageSampler>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id);
    return pSVar1;
  }
  return (SPIRCombinedImageSampler *)0x0;
}

Assistant:

T *maybe_get(uint32_t id)
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}